

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O1

void Abc_NtkCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int iVar10;
  long lVar11;
  
  uVar9 = (ulong)(uint)nFanMax;
  vNext->nSize = 0;
  if (0 < vStart->nSize) {
    lVar7 = 0;
    do {
      plVar2 = (long *)vStart->pArray[lVar7];
      if (0 < *(int *)((long)plVar2 + 0x1c)) {
        lVar11 = 0;
        do {
          plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                             (long)*(int *)(plVar2[4] + lVar11 * 4) * 8);
          if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7) {
            lVar4 = *plVar3;
            iVar10 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar10 + 1,(int)uVar9);
            if (((long)iVar10 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar10)) goto LAB_002d1cc8;
            lVar5 = *plVar3;
            iVar1 = *(int *)(lVar5 + 0xd8);
            uVar9 = extraout_RDX;
            if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar10 * 4) != iVar1) {
              iVar10 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,(int)extraout_RDX);
              if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) goto LAB_002d1ce7;
              *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) = iVar1;
              uVar8 = vNext->nCap;
              if (vNext->nSize == uVar8) {
                if ((int)uVar8 < 0x10) {
                  if (vNext->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vNext->pArray,0x80);
                  }
                  vNext->pArray = ppvVar6;
                  iVar10 = 0x10;
                }
                else {
                  iVar10 = uVar8 * 2;
                  if (iVar10 <= (int)uVar8) goto LAB_002d1b31;
                  if (vNext->pArray == (void **)0x0) {
                    ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
                  }
                  else {
                    ppvVar6 = (void **)realloc(vNext->pArray,(ulong)uVar8 << 4);
                  }
                  vNext->pArray = ppvVar6;
                }
                vNext->nCap = iVar10;
              }
LAB_002d1b31:
              iVar10 = vNext->nSize;
              uVar8 = iVar10 + 1;
              uVar9 = (ulong)uVar8;
              vNext->nSize = uVar8;
              vNext->pArray[iVar10] = plVar3;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar2 + 0x1c));
      }
      if (0 < *(int *)((long)plVar2 + 0x2c)) {
        lVar11 = 0;
        do {
          plVar3 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                             (long)*(int *)(plVar2[6] + lVar11 * 4) * 8);
          if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7) {
            lVar4 = *plVar3;
            iVar10 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar10 + 1,(int)uVar9);
            if (((long)iVar10 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar10)) {
LAB_002d1cc8:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar5 = *plVar3;
            iVar1 = *(int *)(lVar5 + 0xd8);
            uVar9 = extraout_RDX_00;
            if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar10 * 4) != iVar1) {
              iVar10 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar10 + 1,(int)extraout_RDX_00);
              if (((long)iVar10 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar10)) {
LAB_002d1ce7:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar10 * 4) = iVar1;
              uVar9 = extraout_RDX_01;
              if (*(int *)((long)plVar3 + 0x2c) <= nFanMax) {
                uVar8 = vNext->nCap;
                if (vNext->nSize == uVar8) {
                  if ((int)uVar8 < 0x10) {
                    if (vNext->pArray == (void **)0x0) {
                      ppvVar6 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar6 = (void **)realloc(vNext->pArray,0x80);
                    }
                    vNext->pArray = ppvVar6;
                    iVar10 = 0x10;
                  }
                  else {
                    iVar10 = uVar8 * 2;
                    if (iVar10 <= (int)uVar8) goto LAB_002d1c7c;
                    if (vNext->pArray == (void **)0x0) {
                      ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
                    }
                    else {
                      ppvVar6 = (void **)realloc(vNext->pArray,(ulong)uVar8 << 4);
                    }
                    vNext->pArray = ppvVar6;
                  }
                  vNext->nCap = iVar10;
                }
LAB_002d1c7c:
                iVar10 = vNext->nSize;
                uVar8 = iVar10 + 1;
                uVar9 = (ulong)uVar8;
                vNext->nSize = uVar8;
                vNext->pArray[iVar10] = plVar3;
              }
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar2 + 0x2c));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStart->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Abc_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            if ( Abc_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}